

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::ExtractSecretEcdsaAdaptor
          (JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::SecretDataStruct(cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_const&)>
  ::
  function<cfd::js::api::SecretDataStruct(&)(cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_const&),void>
            ((function<cfd::js::api::SecretDataStruct(cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_const&)>
              *)&local_38,SchnorrApi::ExtractSecretEcdsaAdaptor);
  ExecuteJsonApi<cfd::js::api::json::ExtractSecretEcdsaAdaptorRequest,cfd::js::api::json::SecretData,cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct,cfd::js::api::SecretDataStruct>
            ((json *)this,request_message,&local_38);
  std::
  function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::ExtractSecretEcdsaAdaptor(
    const std::string &request_message) {
  return ExecuteJsonApi<
      ExtractSecretEcdsaAdaptorRequest, SecretData,
      ExtractSecretEcdsaAdaptorRequestStruct, SecretDataStruct>(
      request_message, SchnorrApi::ExtractSecretEcdsaAdaptor);
}